

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

void lws_wsi_mux_sibling_disconnect(lws *wsi)

{
  uint *puVar1;
  lws **pplVar2;
  lws *plVar3;
  lws *plVar4;
  lws *plVar5;
  
  plVar3 = (wsi->mux).parent_wsi;
  plVar5 = (plVar3->mux).child_list;
  if (plVar5 != (lws *)0x0) {
    if (plVar5 == wsi) {
      pplVar2 = &(plVar3->mux).child_list;
    }
    else {
      do {
        plVar4 = plVar5;
        plVar5 = (plVar4->mux).sibling_list;
        if (plVar5 == (lws *)0x0) goto LAB_0011761f;
      } while (plVar5 != wsi);
      pplVar2 = &(plVar4->mux).sibling_list;
    }
    plVar3 = (plVar5->mux).sibling_list;
    (plVar5->mux).sibling_list = (lws *)0x0;
    *pplVar2 = plVar3;
    _lws_log(0x10,"  %p disentangled from sibling %p\n",wsi);
    plVar3 = (wsi->mux).parent_wsi;
  }
LAB_0011761f:
  puVar1 = &(plVar3->mux).child_count;
  *puVar1 = *puVar1 - 1;
  (wsi->mux).parent_wsi = (lws *)0x0;
  return;
}

Assistant:

void
lws_wsi_mux_sibling_disconnect(struct lws *wsi)
{
	struct lws *wsi2;

	lws_start_foreach_llp(struct lws **, w,
			      wsi->mux.parent_wsi->mux.child_list) {

		/* disconnect from siblings */
		if (*w == wsi) {
			wsi2 = (*w)->mux.sibling_list;
			(*w)->mux.sibling_list = NULL;
			*w = wsi2;
			lwsl_debug("  %p disentangled from sibling %p\n",
				  wsi, wsi2);
			break;
		}
	} lws_end_foreach_llp(w, mux.sibling_list);
	wsi->mux.parent_wsi->mux.child_count--;

	wsi->mux.parent_wsi = NULL;
}